

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_retrieveDuplicateIdItemsWithIndex_Test::TestBody
          (Annotator_retrieveDuplicateIdItemsWithIndex_Test *this)

{
  long *plVar1;
  _Storage *p_Var2;
  _Storage *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar4;
  pointer ppVar5;
  code *pcVar6;
  string sVar7;
  undefined8 uVar8;
  _func_void__Op_any_ptr__Arg_ptr *p_Var9;
  undefined8 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char cVar12;
  undefined4 uVar13;
  mapped_type *pmVar14;
  void *pvVar15;
  undefined8 *puVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_7;
  long lVar17;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer __k;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_04;
  ModelPtr model;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  VariablePtr c4v2;
  VariablePtr c2v2;
  VariablePtr c2v1;
  AnyCellmlElementPtr item;
  VariablePtr c3v1;
  AnnotatorPtr annotator;
  VariablePtr c4v1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  ParserPtr parser;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9d8;
  undefined8 local_9d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9c0;
  allocator_type local_9b6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9b5;
  allocator_type local_9b4;
  allocator_type local_9b3;
  allocator_type local_9b2;
  allocator_type local_9b1;
  pair<libcellml::CellmlElementType,_std::any> local_9b0;
  undefined4 local_998;
  code *local_990;
  undefined8 *local_988;
  undefined4 local_980;
  code *local_978;
  undefined8 *local_970;
  undefined4 local_968;
  code *local_960;
  undefined8 *local_958;
  undefined4 local_950;
  code *local_948;
  undefined8 *local_940;
  undefined4 local_938;
  code *local_930;
  undefined8 *local_928;
  undefined4 local_920;
  code *local_918;
  undefined8 *local_910;
  pair<libcellml::CellmlElementType,_std::any> local_908;
  undefined4 local_8f0;
  code *local_8e8;
  undefined8 *local_8e0;
  undefined4 local_8d8;
  code *local_8d0;
  undefined8 *local_8c8;
  undefined4 local_8c0;
  code *local_8b8;
  undefined8 *local_8b0;
  undefined4 local_8a8;
  code *local_8a0;
  undefined8 *local_898;
  undefined4 local_890;
  code *local_888;
  undefined8 *local_880;
  undefined4 local_878;
  code *local_870;
  undefined8 *local_868;
  undefined4 local_860;
  code *local_858;
  undefined8 *local_850;
  pair<libcellml::CellmlElementType,_std::any> local_840;
  undefined4 local_828;
  code *local_820;
  undefined8 *local_818;
  undefined4 local_810;
  code *local_808;
  undefined8 *local_800;
  undefined4 local_7f8;
  code *local_7f0;
  undefined8 *local_7e8;
  undefined4 local_7e0;
  code *local_7d8;
  undefined8 *local_7d0;
  undefined4 local_7c8;
  code *local_7c0;
  undefined8 *local_7b8;
  undefined4 local_7b0;
  code *local_7a8;
  undefined8 *local_7a0;
  shared_ptr<libcellml::Units> local_798;
  long local_788 [2];
  undefined8 local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_770;
  undefined8 local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_760;
  undefined8 local_758;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_750;
  undefined1 local_748 [32];
  pointer local_728;
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_6e8 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_6a0;
  undefined8 local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_660;
  undefined8 local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  undefined8 local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  undefined8 local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_610;
  undefined8 local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_600;
  undefined8 local_5f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5f0;
  undefined8 local_5e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5e0;
  undefined8 local_5d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5d0;
  undefined8 local_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5c0;
  undefined8 local_5b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5b0;
  undefined8 local_5a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5a0;
  undefined8 local_598;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_590;
  undefined8 local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_580;
  undefined8 local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_570;
  undefined8 local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_560;
  pair<libcellml::CellmlElementType,_std::any> local_558;
  undefined4 local_540;
  code *local_538;
  undefined8 *local_530;
  undefined4 local_528;
  code *local_520;
  undefined8 *local_518;
  undefined4 local_510;
  code *local_508;
  undefined8 *local_500;
  undefined4 local_4f8;
  code *local_4f0;
  undefined8 *local_4e8;
  undefined4 local_4e0;
  code *local_4d8;
  undefined8 *local_4d0;
  undefined4 local_4c8;
  code *local_4c0;
  undefined8 *local_4b8;
  undefined4 local_4b0;
  code *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  local_488;
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  key_type *local_1f8;
  string local_1f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  string local_1e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  string local_1d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  string local_1c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  string local_1b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  string local_1a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  string local_190 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  string local_180 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  string local_170 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  string local_160 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  long *local_138 [2];
  long local_128 [2];
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_90;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_78;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_60;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_48;
  
  plVar1 = (long *)(local_748 + 0x10);
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"duplicateId1","");
  local_728 = (pointer)local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"duplicateId2","");
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"duplicateId3","");
  ppVar21 = &local_6d8;
  local_6e8[0] = ppVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"duplicateId4","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_748;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l,(allocator_type *)&local_558);
  lVar17 = -0x80;
  do {
    ppVar4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)ppVar21[-1].second.
                super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar21 != ppVar4) {
      operator_delete(ppVar4,(ulong)((ppVar21->first)._M_dataplus._M_p + 1));
    }
    ppVar21 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
               *)((long)&ppVar21[-1].first.field_2 + 8);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0);
  libcellml::Parser::create(SUB81(local_a0,0));
  libcellml::Parser::parseModel((string *)&local_9d0);
  uVar8 = local_9d0;
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"component2","");
  libcellml::ComponentEntity::component((string *)&local_908,SUB81(uVar8,0));
  p_Var2 = &local_558.second._M_storage;
  local_558._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"variable1","");
  libcellml::Component::variable((string *)&local_758);
  if ((_Storage *)local_558._0_8_ != p_Var2) {
    operator_delete((void *)local_558._0_8_,(long)local_558.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager);
  }
  if ((long *)local_748._0_8_ != plVar1) {
    operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
  }
  uVar8 = local_9d0;
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"component2","");
  libcellml::ComponentEntity::component((string *)&local_908,SUB81(uVar8,0));
  local_558._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"variable2","");
  libcellml::Component::variable((string *)&local_768);
  if ((_Storage *)local_558._0_8_ != p_Var2) {
    operator_delete((void *)local_558._0_8_,(long)local_558.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager);
  }
  if ((long *)local_748._0_8_ != plVar1) {
    operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
  }
  uVar8 = local_9d0;
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"component2","");
  libcellml::ComponentEntity::component((string *)&local_840,SUB81(uVar8,0));
  uVar8 = local_840._0_8_;
  local_558._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"component3","");
  libcellml::ComponentEntity::component((string *)&local_9b0,SUB81(uVar8,0));
  p_Var3 = &local_908.second._M_storage;
  local_908._0_8_ = p_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"variable1","");
  libcellml::Component::variable((string *)&local_668);
  if ((_Storage *)local_908._0_8_ != p_Var3) {
    operator_delete((void *)local_908._0_8_,(long)local_908.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager);
  }
  if ((_Storage *)local_558._0_8_ != p_Var2) {
    operator_delete((void *)local_558._0_8_,(long)local_558.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager);
  }
  if ((long *)local_748._0_8_ != plVar1) {
    operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
  }
  uVar8 = local_9d0;
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"component4","");
  libcellml::ComponentEntity::component((string *)&local_908,SUB81(uVar8,0));
  local_558._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"variable1","");
  libcellml::Component::variable((string *)&local_498);
  if ((_Storage *)local_558._0_8_ != p_Var2) {
    operator_delete((void *)local_558._0_8_,(long)local_558.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager);
  }
  if ((long *)local_748._0_8_ != plVar1) {
    operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
  }
  uVar8 = local_9d0;
  local_748._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"component4","");
  libcellml::ComponentEntity::component((string *)&local_908,SUB81(uVar8,0));
  local_558._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"variable2","");
  libcellml::Component::variable((string *)&local_778);
  if ((_Storage *)local_558._0_8_ != p_Var2) {
    operator_delete((void *)local_558._0_8_,(long)local_558.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager);
  }
  if ((long *)local_748._0_8_ != plVar1) {
    operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
  }
  local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_788;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"units2","");
  libcellml::Model::units((string *)&local_568);
  p_Var22 = p_Stack_560;
  uVar10 = local_568;
  local_568 = 0;
  p_Stack_560 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_558.first = 0xd;
  local_558.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_558.second._M_storage._M_ptr = (void *)0x0;
  local_558.second._M_storage._M_ptr = operator_new(0x10);
  uVar8 = local_9d0;
  *(undefined8 *)local_558.second._M_storage._M_ptr = uVar10;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_558.second._M_storage._M_ptr + 8) =
       p_Var22;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"component1","");
  libcellml::ComponentEntity::component(local_160,SUB81(uVar8,0));
  libcellml::ImportedEntity::importSource();
  p_Var22 = p_Stack_570;
  uVar8 = local_578;
  local_578 = 0;
  p_Stack_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_540 = 4;
  local_538 = std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_530 = (undefined8 *)0x0;
  local_530 = (undefined8 *)operator_new(0x10);
  *local_530 = uVar8;
  local_530[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_b8,(shared_ptr *)&local_498);
  p_Var22 = p_Stack_b0;
  uVar10 = local_b8;
  local_b8 = 0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_528 = 5;
  local_520 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_518 = (undefined8 *)0x0;
  local_518 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_518 = uVar10;
  local_518[1] = p_Var22;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"component2","");
  libcellml::ComponentEntity::component((string *)&local_588,SUB81(uVar8,0));
  p_Var22 = p_Stack_580;
  uVar8 = local_588;
  local_588 = 0;
  p_Stack_580 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_510 = 0;
  local_508 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_500 = (undefined8 *)0x0;
  local_500 = (undefined8 *)operator_new(0x10);
  *local_500 = uVar8;
  local_500[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_c8,(shared_ptr *)&local_758);
  p_Var22 = p_Stack_c0;
  uVar10 = local_c8;
  local_c8 = 0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4f8 = 2;
  local_4f0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_4e8 = (undefined8 *)0x0;
  local_4e8 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_4e8 = uVar10;
  local_4e8[1] = p_Var22;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"component2","");
  libcellml::ComponentEntity::component(local_170,SUB81(uVar8,0));
  libcellml::Component::reset((ulong)&local_598);
  p_Var22 = p_Stack_590;
  uVar10 = local_598;
  local_598 = 0;
  p_Stack_590 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e0 = 10;
  local_4d8 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_4d0 = (undefined8 *)0x0;
  local_4d0 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_4d0 = uVar10;
  local_4d0[1] = p_Var22;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"component2","");
  libcellml::ComponentEntity::component(local_180,SUB81(uVar8,0));
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"component3","");
  libcellml::ComponentEntity::component((string *)&local_5a8,(bool)local_180[0]);
  p_Var22 = p_Stack_5a0;
  uVar10 = local_5a8;
  local_5a8 = 0;
  p_Stack_5a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4c8 = 1;
  local_4c0 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_4b8 = (undefined8 *)0x0;
  local_4b8 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_4b8 = uVar10;
  local_4b8[1] = p_Var22;
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"component2","");
  libcellml::ComponentEntity::component(local_1a0,SUB81(uVar8,0));
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"component3","");
  libcellml::ComponentEntity::component(local_190,(bool)local_1a0[0]);
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"variable2","");
  libcellml::Component::variable((string *)&local_5b8);
  p_Var22 = p_Stack_5b0;
  uVar8 = local_5b8;
  local_5b8 = 0;
  p_Stack_5b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b0 = 0xe;
  local_4a8 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_4a0 = (undefined8 *)0x0;
  local_4a0 = (undefined8 *)operator_new(0x10);
  *local_4a0 = uVar8;
  local_4a0[1] = p_Var22;
  __l_00._M_len = 8;
  __l_00._M_array = &local_558;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_48,__l_00,&local_9b1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)local_748,(char (*) [13])"duplicateId1",&local_48);
  p_Var22 = local_9c8;
  uVar8 = local_9d0;
  if (local_9c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9c8 + 8) = *(int *)(local_9c8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9c8 + 8) = *(int *)(local_9c8 + 8) + 1;
    }
  }
  local_908.first = MODEL;
  local_908.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_908.second._M_storage._M_ptr = (void *)0x0;
  local_908.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_908.second._M_storage._M_ptr = uVar8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_908.second._M_storage._M_ptr + 8) =
       p_Var22;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"units1","");
  libcellml::Model::units((string *)&local_5c8);
  p_Var22 = p_Stack_5c0;
  uVar8 = local_5c8;
  local_5c8 = 0;
  p_Stack_5c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8f0 = 0xd;
  local_8e8 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_8e0 = (undefined8 *)0x0;
  local_8e0 = (undefined8 *)operator_new(0x10);
  *local_8e0 = uVar8;
  local_8e0[1] = p_Var22;
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"blob","");
  libcellml::Model::units((string *)&local_5d8);
  p_Var22 = p_Stack_5d0;
  uVar8 = local_5d8;
  local_5d8 = 0;
  p_Stack_5d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8d8 = 0xd;
  local_8d0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_8c8 = (undefined8 *)0x0;
  local_8c8 = (undefined8 *)operator_new(0x10);
  *local_8c8 = uVar8;
  local_8c8[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_d8,(shared_ptr *)&local_778);
  p_Var11 = p_Stack_d0;
  uVar8 = local_d8;
  local_d8 = 0;
  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8c0 = 2;
  local_8b8 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_8b0 = (undefined8 *)0x0;
  local_8b0 = (undefined8 *)operator_new(0x10);
  p_Var22 = local_770;
  *local_8b0 = uVar8;
  local_8b0[1] = p_Var11;
  if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_770 + 8) = *(int *)(local_770 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_770 + 8) = *(int *)(local_770 + 8) + 1;
    }
  }
  local_8a8 = 0xe;
  local_8a0 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_898 = (undefined8 *)0x0;
  local_898 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_898 = local_778;
  local_898[1] = p_Var22;
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"component2","");
  libcellml::ComponentEntity::component((string *)&local_5e8,SUB81(uVar8,0));
  p_Var22 = p_Stack_5e0;
  uVar10 = local_5e8;
  local_5e8 = 0;
  p_Stack_5e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_890 = 1;
  local_888 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_880 = (undefined8 *)0x0;
  local_880 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_880 = uVar10;
  local_880[1] = p_Var22;
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"component2","");
  libcellml::ComponentEntity::component(local_1b0,SUB81(uVar8,0));
  libcellml::Component::reset((ulong)&local_5f8);
  p_Var11 = p_Stack_5f0;
  uVar8 = local_5f8;
  local_5f8 = 0;
  p_Stack_5f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_878 = 8;
  local_870 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_868 = (undefined8 *)0x0;
  local_868 = (undefined8 *)operator_new(0x10);
  p_Var22 = local_660;
  *local_868 = uVar8;
  local_868[1] = p_Var11;
  if (local_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_660 + 8) = *(int *)(local_660 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_660 + 8) = *(int *)(local_660 + 8) + 1;
    }
  }
  local_860 = 0xe;
  local_858 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_850 = (undefined8 *)0x0;
  local_850 = (undefined8 *)operator_new(0x10);
  *local_850 = local_668;
  local_850[1] = p_Var22;
  __l_01._M_len = 8;
  __l_01._M_array = &local_908;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_60,__l_01,&local_9b2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)(local_718 + 8),(char (*) [13])"duplicateId2",&local_60);
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"units1","");
  libcellml::Model::units(local_1c0);
  libcellml::ImportedEntity::importSource();
  p_Var22 = p_Stack_600;
  uVar8 = local_608;
  local_608 = 0;
  p_Stack_600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9b0.first = 4;
  local_9b0.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_9b0.second._M_storage._M_ptr = (void *)0x0;
  local_9b0.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_9b0.second._M_storage._M_ptr = uVar8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_9b0.second._M_storage._M_ptr + 8) =
       p_Var22;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"units3","");
  libcellml::Model::units((string *)&local_618);
  p_Var22 = p_Stack_610;
  uVar8 = local_618;
  local_618 = 0;
  p_Stack_610 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_998 = 0xd;
  local_990 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_988 = (undefined8 *)0x0;
  local_988 = (undefined8 *)operator_new(0x10);
  p_Var11 = local_490;
  *local_988 = uVar8;
  local_988[1] = p_Var22;
  if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_490 + 8) = *(int *)(local_490 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_490 + 8) = *(int *)(local_490 + 8) + 1;
    }
  }
  local_980 = 0xe;
  local_978 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_970 = (undefined8 *)0x0;
  local_970 = (undefined8 *)operator_new(0x10);
  p_Var22 = local_760;
  *local_970 = local_498;
  local_970[1] = p_Var11;
  if (local_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_760 + 8) = *(int *)(local_760 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_760 + 8) = *(int *)(local_760 + 8) + 1;
    }
  }
  local_968 = 0xe;
  local_960 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_958 = (undefined8 *)0x0;
  local_958 = (undefined8 *)operator_new(0x10);
  *local_958 = local_768;
  local_958[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_e8,(shared_ptr *)&local_768);
  p_Var22 = p_Stack_e0;
  uVar10 = local_e8;
  local_e8 = 0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_950 = 5;
  local_948 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_940 = (undefined8 *)0x0;
  local_940 = (undefined8 *)operator_new(0x10);
  uVar8 = local_9d0;
  *local_940 = uVar10;
  local_940[1] = p_Var22;
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"component2","");
  libcellml::ComponentEntity::component(local_1d0,SUB81(uVar8,0));
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"component3","");
  libcellml::ComponentEntity::component((string *)&local_628,(bool)local_1d0[0]);
  p_Var11 = p_Stack_620;
  uVar10 = local_628;
  local_628 = 0;
  p_Stack_620 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_938 = 0;
  local_930 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_928 = (undefined8 *)0x0;
  local_928 = (undefined8 *)operator_new(0x10);
  p_Var22 = local_9c8;
  uVar8 = local_9d0;
  *local_928 = uVar10;
  local_928[1] = p_Var11;
  if (local_9c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9c8 + 8) = *(int *)(local_9c8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9c8 + 8) = *(int *)(local_9c8 + 8) + 1;
    }
  }
  local_920 = 3;
  local_918 = std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_910 = (undefined8 *)0x0;
  local_910 = (undefined8 *)operator_new(0x10);
  *local_910 = uVar8;
  local_910[1] = p_Var22;
  __l_02._M_len = 7;
  __l_02._M_array = &local_9b0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_78,__l_02,&local_9b3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_6d8,(char (*) [13])"duplicateId3",&local_78);
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"units2","");
  libcellml::Model::units(local_1e0);
  libcellml::UnitsItem::create((shared_ptr *)&local_f8,(ulong)local_1e0);
  p_Var22 = p_Stack_f0;
  uVar8 = local_f8;
  local_f8 = 0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_840.first = 0xc;
  local_840.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::UnitsItem>_>::_S_manage;
  local_840.second._M_storage._M_ptr = (void *)0x0;
  local_840.second._M_storage._M_ptr = operator_new(0x10);
  sVar7 = local_9d0._0_1_;
  *(undefined8 *)local_840.second._M_storage._M_ptr = uVar8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_840.second._M_storage._M_ptr + 8) =
       p_Var22;
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"component1","");
  libcellml::ComponentEntity::component((string *)&local_638,(bool)sVar7);
  p_Var22 = p_Stack_630;
  uVar8 = local_638;
  local_638 = 0;
  p_Stack_630 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_828 = 0;
  local_820 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_818 = (undefined8 *)0x0;
  local_818 = (undefined8 *)operator_new(0x10);
  sVar7 = local_9d0._0_1_;
  *local_818 = uVar8;
  local_818[1] = p_Var22;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"component4","");
  libcellml::ComponentEntity::component((string *)&local_648,(bool)sVar7);
  p_Var22 = p_Stack_640;
  uVar8 = local_648;
  local_648 = 0;
  p_Stack_640 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_810 = 0;
  local_808 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_800 = (undefined8 *)0x0;
  local_800 = (undefined8 *)operator_new(0x10);
  *local_800 = uVar8;
  local_800[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_108,(shared_ptr *)&local_758);
  p_Var11 = p_Stack_100;
  uVar8 = local_108;
  local_108 = 0;
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7f8 = 5;
  local_7f0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7e8 = (undefined8 *)0x0;
  local_7e8 = (undefined8 *)operator_new(0x10);
  p_Var22 = local_750;
  *local_7e8 = uVar8;
  local_7e8[1] = p_Var11;
  if (local_750 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_750 + 8) = *(int *)(local_750 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_750 + 8) = *(int *)(local_750 + 8) + 1;
    }
  }
  local_7e0 = 0xe;
  local_7d8 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_7d0 = (undefined8 *)0x0;
  local_7d0 = (undefined8 *)operator_new(0x10);
  *local_7d0 = local_758;
  local_7d0[1] = p_Var22;
  libcellml::VariablePair::create((shared_ptr *)&local_118,(shared_ptr *)&local_768);
  p_Var22 = p_Stack_110;
  uVar8 = local_118;
  local_118 = 0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7c8 = 5;
  local_7c0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7b8 = (undefined8 *)0x0;
  local_7b8 = (undefined8 *)operator_new(0x10);
  *local_7b8 = uVar8;
  local_7b8[1] = p_Var22;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"component2","");
  libcellml::ComponentEntity::component(local_1f0,(bool)local_9d0._0_1_);
  libcellml::Component::reset((ulong)&local_658);
  p_Var22 = p_Stack_650;
  uVar8 = local_658;
  local_658 = 0;
  p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7b0 = 9;
  local_7a8 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_7a0 = (undefined8 *)0x0;
  local_7a0 = (undefined8 *)operator_new(0x10);
  *local_7a0 = uVar8;
  local_7a0[1] = p_Var22;
  __l_03._M_len = 7;
  __l_03._M_array = &local_840;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_90,__l_03,&local_9b4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_6a0,(char (*) [13])"duplicateId4",&local_90);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_748;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
         *)&local_488,__l_04,&local_9b5,&local_9b6);
  lVar17 = -0xe0;
  this_00 = &local_6a0.second;
  do {
    std::
    vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
    ::~vector(this_00);
    ppVar5 = this_00[-2].
             super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(this_00 + -1) + 8) != ppVar5) {
      operator_delete(ppVar5,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(this_00 + -1) + 8))->_M_allocated_capacity)
                                            ->first + 1));
    }
    this_00 = (vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
               *)&this_00[-3].
                  super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar17 = lVar17 + 0x38;
  } while (lVar17 != 0);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_90);
  lVar17 = 0x98;
  do {
    pcVar6 = *(code **)((long)&local_840.first + lVar17);
    if (pcVar6 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_840.first + lVar17);
      (*pcVar6)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_650);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  if (p_Stack_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_640);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (p_Stack_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_630);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_78);
  lVar17 = 0x98;
  do {
    pcVar6 = *(code **)((long)&local_9b0.first + lVar17);
    if (pcVar6 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_9b0.first + lVar17);
      (*pcVar6)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_620);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  if (p_Stack_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_610);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (p_Stack_600 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_600);
  }
  if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_60);
  lVar17 = 0xb0;
  do {
    pcVar6 = *(code **)((long)&local_908.first + lVar17);
    if (pcVar6 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_908.first + lVar17);
      (*pcVar6)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_5f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5f0);
  }
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (p_Stack_5e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5e0);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  if (p_Stack_5d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5d0);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (p_Stack_5c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5c0);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_48);
  lVar17 = 0xb0;
  do {
    pcVar6 = *(code **)((long)&local_558.first + lVar17);
    if (pcVar6 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_558.first + lVar17);
      (*pcVar6)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5b0);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if (p_Stack_5a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5a0);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (p_Stack_590 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_590);
  }
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if (p_Stack_580 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_580);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (p_Stack_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_570);
  }
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if (p_Stack_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_560);
  }
  if (local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_788) {
    operator_delete(local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_788[0] + 1);
  }
  libcellml::Annotator::create();
  libcellml::Annotator::setModel((shared_ptr *)local_558._0_8_);
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&local_908,"ids","annotator->duplicateIds()",&local_150,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_748);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_748);
  if ((undefined1)local_908.first == COMPONENT) {
    testing::Message::Message((Message *)local_748);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar19 = "";
    }
    else {
      pcVar19 = *(char **)local_908.second._M_manager;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7b2,pcVar19);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_9b0,(Message *)local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
    if ((long *)local_748._0_8_ != (long *)0x0) {
      cVar12 = testing::internal::IsTrue(true);
      if ((cVar12 != '\0') && ((long *)local_748._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_748._0_8_ + 8))();
      }
      local_748._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_908.second,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1f8 = local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_9c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_9d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __k = local_150.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar17 = libcellml::Annotator::itemCount((string *)local_558._0_8_);
      if (lVar17 != 0) {
        lVar20 = 8;
        lVar18 = 0;
        do {
          libcellml::Annotator::item((string *)local_748,local_558._0_8_);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                  *)&local_488,__k);
          ppVar5 = (pmVar14->
                   super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar13 = libcellml::AnyCellmlElement::type();
          local_9b0.first = uVar13;
          testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                    ((internal *)&local_908,"expectedItems[id][index].first","item->type()",
                     (CellmlElementType *)((long)ppVar5 + lVar20 + -8),&local_9b0.first);
          if ((undefined1)local_908.first == COMPONENT) {
            testing::Message::Message((Message *)&local_9b0);
            pcVar19 = "";
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pcVar19 = *(char **)local_908.second._M_manager;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_840,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                       ,0x7b9,pcVar19);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_840,(Message *)&local_9b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
            if ((long *)local_9b0._0_8_ != (long *)0x0) {
              cVar12 = testing::internal::IsTrue(true);
              if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9b0._0_8_ + 8))();
              }
              local_9b0._0_8_ = (long *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_908.second,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar13 = libcellml::AnyCellmlElement::type();
          switch(uVar13) {
          case 0:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9b0,
                       (shared_ptr<libcellml::Component> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7bd,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 1:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9b0,
                       (shared_ptr<libcellml::Component> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7c0,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 2:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar15 = std::__any_caster<std::shared_ptr<libcellml::VariablePair>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (pvVar15 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var22 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar15 + 8);
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
              }
            }
            if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c0);
            }
            libcellml::AnyCellmlElement::variablePair();
            goto LAB_0015710a;
          case 3:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9b0,
                       (shared_ptr<libcellml::Model> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7c7,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 4:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::ImportSource>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::importSource();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                       "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&local_9b0,
                       (shared_ptr<libcellml::ImportSource> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7ca,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 5:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar15 = std::__any_caster<std::shared_ptr<libcellml::VariablePair>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (pvVar15 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var22 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar15 + 8);
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
              }
            }
            if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c0);
            }
            libcellml::AnyCellmlElement::variablePair();
LAB_0015710a:
            p_Var9 = local_908.second._M_manager;
            local_908.first = COMPONENT;
            local_908._4_4_ = 0;
            local_908.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            if (local_9d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9d8);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager
                        );
            }
            local_9d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
            local_9c0 = p_Var22;
            break;
          case 7:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9b0,
                       (shared_ptr<libcellml::Model> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d1,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 8:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b0,
                       (shared_ptr<libcellml::Reset> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d4,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 9:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b0,
                       (shared_ptr<libcellml::Reset> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d7,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 10:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9b0,
                       (shared_ptr<libcellml::Reset> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7da,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xc:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar15 = std::__any_caster<std::shared_ptr<libcellml::UnitsItem>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (pvVar15 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var22 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar15 + 8);
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var22 + 8) = *(int *)(p_Var22 + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::unitsItem();
            libcellml::UnitsItem::units();
            libcellml::UnitsItem::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_9b0,"ue->units()","ua->units()",
                       (shared_ptr<libcellml::Units> *)&local_840,&local_798);
            if (local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((undefined1)local_9b0.first == COMPONENT) {
              testing::Message::Message((Message *)&local_840);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_9b0.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_798,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7df,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_798,(Message *)&local_840);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
              if ((long *)local_840._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_840._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_840._0_8_ + 8))();
                }
                local_840._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9b0.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_840._0_8_ = libcellml::UnitsItem::index();
            local_798.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)libcellml::UnitsItem::index();
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_9b0,"ue->index()","ua->index()",
                       (unsigned_long *)&local_840,(unsigned_long *)&local_798);
            if ((undefined1)local_9b0.first == COMPONENT) {
              testing::Message::Message((Message *)&local_840);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_9b0.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_798,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e0,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_798,(Message *)&local_840);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
              if ((long *)local_840._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_840._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_840._0_8_ + 8))();
                }
                local_840._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9b0.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager
                        );
            }
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            break;
          case 0xd:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Units>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                       "item->units()",(shared_ptr<libcellml::Units> *)&local_9b0,
                       (shared_ptr<libcellml::Units> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e4,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xe:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Variable>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar20));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9b0._0_8_ = *puVar16;
            local_9b0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar16[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9b0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::variable();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                      ((internal *)&local_908,
                       "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                       "item->variable()",(shared_ptr<libcellml::Variable> *)&local_9b0,
                       (shared_ptr<libcellml::Variable> *)&local_840);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b0.second._M_manager
                        );
            }
            if ((undefined1)local_908.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar19 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar19 = *(char **)local_908.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_840,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e7,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_840,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_840);
              if ((long *)local_9b0._0_8_ != (long *)0x0) {
                cVar12 = testing::internal::IsTrue(true);
                if ((cVar12 != '\0') && ((long *)local_9b0._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_9b0._0_8_ + 8))();
                }
                local_9b0._0_8_ = (long *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_908.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          if ((pointer)local_748._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_748._8_8_);
          }
          lVar18 = lVar18 + 1;
          lVar20 = lVar20 + 0x18;
        } while (lVar17 != lVar18);
      }
      __k = __k + 1;
    } while (__k != local_1f8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558.second._M_manager);
  }
  if (local_9d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9d8);
  }
  if (local_9c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::~_Rb_tree(&local_488);
  if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_770);
  }
  if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
  }
  if (local_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660);
  }
  if (local_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_760);
  }
  if (local_750 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_750);
  }
  if (local_9c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9c8);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}